

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

size_t lodepng_get_raw_size_idat(uint w,uint h,LodePNGColorMode *color)

{
  uint uVar1;
  
  uVar1 = lodepng_get_bpp(color);
  return (ulong)h * (((ulong)(w & 7) * (ulong)uVar1 + 7 >> 3) + (ulong)(w >> 3) * (ulong)uVar1);
}

Assistant:

static size_t lodepng_get_raw_size_idat(unsigned w, unsigned h, const LodePNGColorMode* color)
{
  /*will not overflow for any color type if roughly w * h < 268435455*/
  size_t bpp = lodepng_get_bpp(color);
  size_t line = ((w / 8) * bpp) + ((w & 7) * bpp + 7) / 8;
  return h * line;
}